

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

utf16 __thiscall GrcFont::FirstFreeGlyph(GrcFont *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (long)this->m_nMaxGlyfId + 1;
  sVar1 = TtfUtil::GlyphCount(this->m_pMaxp);
  if (sVar1 <= uVar3) {
    sVar1 = uVar3;
  }
  sVar2 = TtfUtil::LocaGlyphCount(this->m_cLoca,this->m_pHead);
  if (sVar2 < sVar1) {
    sVar2 = sVar1;
  }
  return (utf16)sVar2;
}

Assistant:

utf16 GrcFont::FirstFreeGlyph()
{
#ifdef _DEBUG
	if (m_fDebug)
		//return 0x2200;
		return 0x0200;	// iucdemo
#endif

	Assert(m_pFile); // insure Init() called first
	Assert(m_nMaxGlyfId != -1);  // insure ScanGlyfIds() called
	Assert(m_pMaxp);
	Assert(m_pHead);
	
	size_t suMaxGlyf = 	m_nMaxGlyfId + 1; // assuming glyf ids start at zero

	size_t suTest = TtfUtil::GlyphCount(m_pMaxp);
	suMaxGlyf = max(suMaxGlyf, suTest);

	suTest = TtfUtil::LocaGlyphCount(m_cLoca, m_pHead); // could return -1
	suMaxGlyf = max(suMaxGlyf, suTest);

	return (utf16)suMaxGlyf;
}